

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDyndepCollation.cxx
# Opt level: O0

void cmDyndepCollation::AddCollationInformation
               (Value *tdi,cmGeneratorTarget *gt,string *config,cmDyndepGeneratorCallbacks *cb)

{
  Value *pVVar1;
  Value local_d8;
  Value local_b0;
  Value local_88;
  Value local_50;
  cmDyndepGeneratorCallbacks *local_28;
  cmDyndepGeneratorCallbacks *cb_local;
  string *config_local;
  cmGeneratorTarget *gt_local;
  Value *tdi_local;
  
  local_28 = cb;
  cb_local = (cmDyndepGeneratorCallbacks *)config;
  config_local = (string *)gt;
  gt_local = (cmGeneratorTarget *)tdi;
  anon_unknown.dwarf_15bcb8c::CollationInformationCxxModules(&local_50,gt,config,cb);
  pVVar1 = Json::Value::operator[]((Value *)gt_local,"cxx-modules");
  Json::Value::operator=(pVVar1,&local_50);
  Json::Value::~Value(&local_50);
  anon_unknown.dwarf_15bcb8c::CollationInformationBmiInstallation
            (&local_88,(cmGeneratorTarget *)config_local,(string *)cb_local);
  pVVar1 = Json::Value::operator[]((Value *)gt_local,"bmi-installation");
  Json::Value::operator=(pVVar1,&local_88);
  Json::Value::~Value(&local_88);
  anon_unknown.dwarf_15bcb8c::CollationInformationExports
            (&local_b0,(cmGeneratorTarget *)config_local);
  pVVar1 = Json::Value::operator[]((Value *)gt_local,"exports");
  Json::Value::operator=(pVVar1,&local_b0);
  Json::Value::~Value(&local_b0);
  Json::Value::Value(&local_d8,(String *)cb_local);
  pVVar1 = Json::Value::operator[]((Value *)gt_local,"config");
  Json::Value::operator=(pVVar1,&local_d8);
  Json::Value::~Value(&local_d8);
  return;
}

Assistant:

void cmDyndepCollation::AddCollationInformation(
  Json::Value& tdi, cmGeneratorTarget const* gt, std::string const& config,
  cmDyndepGeneratorCallbacks const& cb)
{
  tdi["cxx-modules"] = CollationInformationCxxModules(gt, config, cb);
  tdi["bmi-installation"] = CollationInformationBmiInstallation(gt, config);
  tdi["exports"] = CollationInformationExports(gt);
  tdi["config"] = config;
}